

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

BSDFSample * __thiscall
pbrt::HairBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,HairBxDF *this,Vector3f wo,Float uc,Point2f *u,
          TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  Float sinTheta_o;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  TransportMode mode_00;
  undefined8 uVar5;
  undefined4 in_register_00000084;
  int p;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  Float FVar10;
  float fVar11;
  Float FVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar21 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar22 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  array<float,_4> aVar28;
  SampledSpectrum SVar29;
  Vector3f wo_00;
  Vector3f wi;
  Float uc_local;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  array<float,_4> apPDF;
  float local_38;
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [56];
  
  local_5c = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._8_56_ = wo._8_56_;
  auVar14._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_a8 = auVar14._0_16_;
  auVar7 = vmovshdup_avx(local_a8);
  auVar24 = ZEXT856(auVar7._8_8_);
  fVar11 = wo.super_Tuple3<pbrt::Vector3,_float>.x * wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar26._0_12_ = ZEXT812(0);
  auVar26._12_4_ = 0;
  auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar11)),auVar26);
  local_98 = vsqrtss_avx(auVar26,auVar26);
  uc_local = uc;
  local_78._0_4_ = uc;
  fVar8 = atan2f(local_5c,auVar7._0_4_);
  auVar21 = ZEXT856((ulong)local_98._8_8_);
  aVar28 = ComputeApPDF(this,local_98._0_4_);
  auVar22._0_8_ = aVar28.values._8_8_;
  auVar22._8_56_ = auVar24;
  auVar15._0_8_ = aVar28.values._0_8_;
  auVar15._8_56_ = auVar21;
  apPDF.values = (float  [4])vmovlhps_avx(auVar15._0_16_,auVar22._0_16_);
  uVar5 = 4;
  iVar4 = SampleDiscrete((pbrt *)&apPDF,(span<const_float>)ZEXT816(4),(Float)local_78._0_4_,
                         &uc_local,(Float *)CONCAT44(in_register_00000084,sampleFlags));
  fVar25 = local_98._0_4_;
  if (iVar4 == 2) {
    FVar10 = this->sin2kAlpha[2];
    FVar12 = this->cos2kAlpha[2];
  }
  else {
    if (iVar4 != 1) {
      local_78._0_4_ = local_a8._0_4_;
      if (iVar4 == 0) {
        auVar26 = vfmsub231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * fVar25)),local_a8,
                                  ZEXT416((uint)this->cos2kAlpha[1]));
        local_78._0_4_ = auVar26._0_4_;
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a8._0_4_ * this->sin2kAlpha[1])),
                                  local_98,ZEXT416((uint)this->cos2kAlpha[1]));
        fVar25 = auVar26._0_4_;
      }
      goto LAB_00426f0b;
    }
    FVar10 = this->sin2kAlpha[0];
    FVar12 = this->cos2kAlpha[0];
  }
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * FVar10)),local_a8,ZEXT416((uint)FVar12));
  local_78._0_4_ = auVar26._0_4_;
  auVar26 = vfmsub231ss_fma(ZEXT416((uint)(FVar10 * (float)local_a8._0_4_)),local_98,
                            ZEXT416((uint)FVar12));
  fVar25 = auVar26._0_4_;
LAB_00426f0b:
  local_58 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  local_88._0_4_ = this->v[iVar4];
  auVar26 = vmaxss_avx(SUB6416(ZEXT464(0x3727c5ac),0),ZEXT416((uint)local_58));
  local_58 = 1.0 - local_58;
  auVar16._0_4_ = expf(-2.0 / (float)local_88._0_4_);
  auVar16._4_60_ = extraout_var;
  auVar26 = vfmadd213ss_fma(auVar16._0_16_,ZEXT416((uint)local_58),ZEXT416(auVar26._0_4_));
  auVar17._0_4_ = logf(auVar26._0_4_);
  auVar17._4_60_ = extraout_var_00;
  auVar26 = vfmadd132ss_fma(auVar17._0_16_,SUB6416(ZEXT464(0x3f800000),0),
                            ZEXT416((uint)local_88._0_4_));
  local_88._0_4_ = auVar26._0_4_;
  auVar7._0_12_ = ZEXT812(0);
  auVar7._12_4_ = 0;
  auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_88._0_4_ * (float)local_88._0_4_)),auVar7);
  auVar26 = vsqrtss_avx(auVar26,auVar26);
  fVar9 = cosf((u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855);
  local_78 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * auVar26._0_4_ * fVar25)),
                              ZEXT416((uint)local_88._0_4_),ZEXT416((uint)local_78._0_4_));
  auVar7 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),ZEXT416((uint)fVar11));
  auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - local_78._0_4_ * local_78._0_4_)),ZEXT816(0) << 0x40);
  auVar7 = vmaxss_avx(auVar7,ZEXT816(0) << 0x40);
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  auVar18._0_4_ = SafeASin(this->h / (auVar7._0_4_ / (float)local_98._0_4_));
  auVar18._4_60_ = extraout_var_01;
  local_88._0_4_ = auVar18._0_4_;
  if (iVar4 < 3) {
    auVar27._0_4_ = (float)(iVar4 * 2);
    auVar27._4_12_ = in_register_00001344;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar18._0_16_,auVar27);
    auVar13._0_4_ = (float)iVar4;
    auVar13._4_12_ = in_register_00001344;
    auVar7 = vfmadd213ss_fma(auVar13,SUB6416(ZEXT464(0x40490fdb),0),auVar7);
    FVar10 = SampleTrimmedLogistic(uc_local,this->s,-3.1415927,3.1415927);
    fVar11 = FVar10 + auVar7._0_4_;
  }
  else {
    fVar11 = uc_local * 6.2831855;
  }
  auVar3._4_12_ = in_register_00001344;
  auVar3._0_4_ = in_XMM5_Da;
  auVar26 = vsqrtss_avx(auVar3,ZEXT416(auVar26._0_4_));
  FVar10 = auVar26._0_4_;
  local_60 = cosf(fVar11 + fVar8);
  local_64 = sinf(fVar11 + fVar8);
  lVar6 = 0;
  local_58 = -(float)local_a8._0_4_;
  uStack_54 = local_a8._4_4_ ^ 0x80000000;
  uStack_50 = local_a8._8_4_ ^ 0x80000000;
  uStack_4c = local_a8._12_4_ ^ 0x80000000;
  local_38 = -local_98._0_4_;
  auVar26 = ZEXT816(0) << 0x20;
  do {
    mode_00 = (TransportMode)uVar5;
    if (lVar6 == 3) {
      local_88 = ZEXT416((uint)(FVar10 * local_60));
      fVar11 = FVar10 * local_64;
      FVar10 = Mp(FVar10,local_98._0_4_,(Float)local_78._0_4_,(Float)local_a8._0_4_,this->v[3]);
      auVar13 = local_a8;
      auVar7 = vfmadd231ss_fma(ZEXT416(auVar26._0_4_),ZEXT416((uint)(FVar10 * apPDF.values[3])),
                               ZEXT416(0x3e22f983));
      local_98 = vinsertps_avx(local_78,ZEXT416((uint)local_88._0_4_),0x10);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_5c;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_a8._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
      auVar24 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar21 = ZEXT856((ulong)local_a8._8_8_);
      wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_98._0_8_;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
      local_a8 = auVar13;
      SVar29 = f(this,wo_00,wi,mode_00);
      auVar23._0_8_ = SVar29.values.values._8_8_;
      auVar23._8_56_ = auVar24;
      auVar20._0_8_ = SVar29.values.values._0_8_;
      auVar20._8_56_ = auVar21;
      auVar26 = vmovlhps_avx(auVar20._0_16_,auVar23._0_16_);
      *(undefined1 (*) [16])(__return_storage_ptr__->f).values.values = auVar26;
      uVar5 = vmovlps_avx(local_98);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar5 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
      __return_storage_ptr__->pdf = auVar7._0_4_;
      __return_storage_ptr__->flags = GlossyReflection;
      return __return_storage_ptr__;
    }
    iVar4 = (int)lVar6;
    if (iVar4 == 2) {
      FVar12 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_00427128:
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ * FVar12)),ZEXT416((uint)FVar1),
                               ZEXT416((uint)local_a8._0_4_));
      sinTheta_o = auVar7._0_4_;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(FVar12 * local_58)),local_98,ZEXT416((uint)FVar1));
    }
    else {
      if (iVar4 == 1) {
        FVar12 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_00427128;
      }
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * local_38)),local_a8,
                               ZEXT416((uint)this->cos2kAlpha[1]));
      sinTheta_o = auVar7._0_4_;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a8._0_4_ * this->sin2kAlpha[1])),local_98
                               ,ZEXT416((uint)this->cos2kAlpha[1]));
    }
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar7,auVar2);
    FVar12 = Mp(FVar10,auVar7._0_4_,(Float)local_78._0_4_,sinTheta_o,this->v[lVar6]);
    fVar8 = apPDF.values[lVar6];
    auVar19._0_4_ = Np(fVar11,iVar4,this->s,this->gamma_o,(Float)local_88._0_4_);
    auVar19._4_60_ = extraout_var_02;
    lVar6 = lVar6 + 1;
    auVar26 = vfmadd231ss_fma(ZEXT416(auVar26._0_4_),auVar19._0_16_,ZEXT416((uint)(FVar12 * fVar8)))
    ;
  } while( true );
}

Assistant:

BSDFSample HairBxDF::Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                              BxDFReflTransFlags sampleFlags) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Determine which term $p$ to sample for hair scattering
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);
    int p = SampleDiscrete(apPDF, uc, nullptr, &uc);

    // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
    Float sinThetap_o, cosThetap_o;
    if (p == 0) {
        sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
        cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
    } else if (p == 1) {
        sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
        cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
    } else if (p == 2) {
        sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
        cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
    } else {
        sinThetap_o = sinTheta_o;
        cosThetap_o = cosTheta_o;
    }

    // Sample $M_p$ to compute $\thetai$
    Float cosTheta = 1 + v[p] * std::log(std::max<Float>(u[0], 1e-5) +
                                         (1 - u[0]) * std::exp(-2 / v[p]));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Float cosPhi = std::cos(2 * Pi * u[1]);
    Float sinTheta_i = -cosTheta * sinThetap_o + sinTheta * cosPhi * cosThetap_o;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));

    // Sample $N_p$ to compute $\Delta\phi$
    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    Float dphi;
    if (p < pMax)
        dphi = Phi(p, gamma_o, gamma_t) + SampleTrimmedLogistic(uc, s, -Pi, Pi);
    else
        dphi = 2 * Pi * uc;

    // Compute _wi_ from sampled hair scattering angles
    Float phi_i = phi_o + dphi;
    Vector3f wi(sinTheta_i, cosTheta_i * std::cos(phi_i), cosTheta_i * std::sin(phi_i));

    // Compute PDF for sampled hair scattering direction _wi_
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        } else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(dphi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    // if (std::abs(wi->x) < .9999) CHECK_NEAR(*pdf, PDF(wo, *wi), .01);

    return BSDFSample(f(wo, wi, mode), wi, pdf, Flags());
}